

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O0

void getaddrinfo_cb(uv_getaddrinfo_t *req,int status,addrinfo *res)

{
  addrinfo *res_local;
  int status_local;
  uv_getaddrinfo_t *req_local;
  
  if (status != -0xbbb) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,100,"status == UV_EAI_CANCELED");
    abort();
  }
  if (res != (addrinfo *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0x65,"res == NULL");
    abort();
  }
  uv_freeaddrinfo(0);
  return;
}

Assistant:

static void getaddrinfo_cb(uv_getaddrinfo_t* handle,
                           int status,
                           struct addrinfo* res) {
  struct getaddrinfo_req* req;

  ASSERT(status == 0);

  req = container_of(handle, struct getaddrinfo_req, handle);
  uv_freeaddrinfo(res);

  if (--req->counter)
    getaddrinfo_do(req);
}